

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O3

TestCaseGroup * vkt::pipeline::createMultisampleInterpolationTests(TestContext *testCtx)

{
  uint uVar1;
  uint uVar2;
  TestNode *this;
  ostream *poVar3;
  TestNode *pTVar4;
  long *plVar5;
  MultisampleCaseBase *node;
  size_type *psVar6;
  long lVar7;
  VkSampleCountFlagBits imageSamples [6];
  ostringstream imageSizeStream;
  undefined8 local_4b0;
  undefined1 local_4a8 [16];
  undefined8 local_498;
  VkSampleCountFlagBits local_488 [8];
  ulong local_468;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  long *local_340 [2];
  long local_330 [2];
  ImageMSParams local_320;
  long local_310 [12];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"multisample_interpolation","Multisample Interpolation");
  local_4a8._0_4_ = 0x80;
  local_4a8._4_4_ = 0x80;
  local_4a8._8_8_ = 0x8900000001;
  local_498 = 0x1000000bf;
  local_488[0] = VK_SAMPLE_COUNT_2_BIT;
  local_488[1] = VK_SAMPLE_COUNT_4_BIT;
  local_488[2] = VK_SAMPLE_COUNT_8_BIT;
  local_488[3] = VK_SAMPLE_COUNT_16_BIT;
  local_488[4] = VK_SAMPLE_COUNT_32_BIT;
  local_488[5] = VK_SAMPLE_COUNT_64_BIT;
  local_4b0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_4b0,testCtx,"sample_interpolate_at_single_sample_","");
  lVar7 = 8;
  do {
    uVar1 = *(uint *)((long)&local_4b0 + lVar7);
    uVar2 = *(uint *)((long)&local_4b0 + lVar7 + 4);
    local_468 = (ulong)*(uint *)(local_4a8 + lVar7);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    pTVar4 = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,testCtx,
               (char *)CONCAT44(local_320.imageSize.m_data[0],local_320.numSamples),"");
    if ((long *)CONCAT44(local_320.imageSize.m_data[0],local_320.numSamples) != local_310) {
      operator_delete((long *)CONCAT44(local_320.imageSize.m_data[0],local_320.numSamples),
                      local_310[0] + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
    std::ostream::operator<<(&local_320,1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
    std::ios_base::~ios_base(local_2b0);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_340,0,(char *)0x0,0xae4ca3);
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_460.field_2._M_allocated_capacity = *psVar6;
      local_460.field_2._8_8_ = plVar5[3];
    }
    else {
      local_460.field_2._M_allocated_capacity = *psVar6;
      local_460._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_460._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_320.numSamples = VK_SAMPLE_COUNT_1_BIT;
    local_320.imageSize.m_data[2] = (uint)local_468;
    local_320.imageSize.m_data[0] = uVar1;
    local_320.imageSize.m_data[1] = uVar2;
    node = multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleSingleSample>::
           createCase(testCtx,&local_460,&local_320);
    tcu::TestNode::addChild(pTVar4,(TestNode *)node);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if (local_340[0] != local_330) {
      operator_delete(local_340[0],local_330[0] + 1);
    }
    tcu::TestNode::addChild(local_4b0,pTVar4);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar7 = lVar7 + 0xc;
  } while (lVar7 != 0x20);
  tcu::TestNode::addChild(this,local_4b0);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_360,"sample_interpolate_at_distinct_values","");
  pTVar4 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleDistinctValues>>
                      (testCtx,&local_360,(UVec3 *)local_4a8,2,local_488,6)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_380,"sample_interpolate_at_ignores_centroid","");
  pTVar4 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleIgnoresCentroid>>
                      (testCtx,&local_380,(UVec3 *)local_4a8,2,local_488,6)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a0,"sample_interpolate_at_consistency","");
  pTVar4 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleConsistency>>
                      (testCtx,&local_3a0,(UVec3 *)local_4a8,2,local_488,6)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c0,"sample_qualifier_distinct_values","");
  pTVar4 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSampleQualifierDistinctValues>>
                      (testCtx,&local_3c0,(UVec3 *)local_4a8,2,local_488,6)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e0,"centroid_interpolate_at_consistency","");
  pTVar4 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtCentroidConsistency>>
                      (testCtx,&local_3e0,(UVec3 *)local_4a8,2,local_488,6)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_400,"centroid_qualifier_inside_primitive","");
  pTVar4 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseCentroidQualifierInsidePrimitive>>
                      (testCtx,&local_400,(UVec3 *)local_4a8,2,local_488,6)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_420,"offset_interpolate_at_pixel_center","");
  pTVar4 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtOffsetPixelCenter>>
                      (testCtx,&local_420,(UVec3 *)local_4a8,2,local_488,6)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_440,"offset_interpolate_at_sample_position","");
  pTVar4 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtOffsetSamplePosition>>
                      (testCtx,&local_440,(UVec3 *)local_4a8,2,local_488,6)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createMultisampleInterpolationTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "multisample_interpolation", "Multisample Interpolation"));

	const tcu::UVec3 imageSizes[] =
	{
		tcu::UVec3(128u, 128u, 1u),
		tcu::UVec3(137u, 191u, 1u),
	};

	const deUint32 sizesElemCount = static_cast<deUint32>(sizeof(imageSizes) / sizeof(tcu::UVec3));

	const vk::VkSampleCountFlagBits imageSamples[] =
	{
		vk::VK_SAMPLE_COUNT_2_BIT,
		vk::VK_SAMPLE_COUNT_4_BIT,
		vk::VK_SAMPLE_COUNT_8_BIT,
		vk::VK_SAMPLE_COUNT_16_BIT,
		vk::VK_SAMPLE_COUNT_32_BIT,
		vk::VK_SAMPLE_COUNT_64_BIT,
	};

	const deUint32 samplesElemCount = static_cast<deUint32>(sizeof(imageSamples) / sizeof(vk::VkSampleCountFlagBits));

	de::MovePtr<tcu::TestCaseGroup> caseGroup(new tcu::TestCaseGroup(testCtx, "sample_interpolate_at_single_sample_", ""));

	for (deUint32 imageSizeNdx = 0u; imageSizeNdx < sizesElemCount; ++imageSizeNdx)
	{
		const tcu::UVec3	imageSize = imageSizes[imageSizeNdx];
		std::ostringstream	imageSizeStream;

		imageSizeStream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

		de::MovePtr<tcu::TestCaseGroup> sizeGroup(new tcu::TestCaseGroup(testCtx, imageSizeStream.str().c_str(), ""));

		sizeGroup->addChild(multisample::MSCase<multisample::MSCaseInterpolateAtSampleSingleSample>::createCase(testCtx, "samples_" + de::toString(1), multisample::ImageMSParams(vk::VK_SAMPLE_COUNT_1_BIT, imageSize)));

		caseGroup->addChild(sizeGroup.release());
	}

	testGroup->addChild(caseGroup.release());

	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtSampleDistinctValues> >	(testCtx, "sample_interpolate_at_distinct_values",	imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtSampleIgnoresCentroid> >(testCtx, "sample_interpolate_at_ignores_centroid",	imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtSampleConsistency> >	(testCtx, "sample_interpolate_at_consistency",		imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseSampleQualifierDistinctValues> >		(testCtx, "sample_qualifier_distinct_values",		imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtCentroidConsistency> >	(testCtx, "centroid_interpolate_at_consistency",	imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseCentroidQualifierInsidePrimitive> >	(testCtx, "centroid_qualifier_inside_primitive",	imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtOffsetPixelCenter> >	(testCtx, "offset_interpolate_at_pixel_center",		imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtOffsetSamplePosition> >	(testCtx, "offset_interpolate_at_sample_position",	imageSizes, sizesElemCount, imageSamples, samplesElemCount));

	return testGroup.release();
}